

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O2

basic_variable<std::allocator<char>_> * __thiscall
trial::dynamic::convert::
into<trial::dynamic::basic_variable<std::allocator<char>>,std::vector<double,std::allocator<double>>>
          (basic_variable<std::allocator<char>_> *__return_storage_ptr__,convert *this,
          vector<double,_std::allocator<double>_> *u)

{
  error *this_00;
  error_code *in_RCX;
  error_code ec;
  error_code error;
  
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  into<trial::dynamic::basic_variable<std::allocator<char>>,std::vector<double,std::allocator<double>>>
            (__return_storage_ptr__,this,(vector<double,_std::allocator<double>_> *)&error,in_RCX);
  if (error._M_value == 0) {
    return __return_storage_ptr__;
  }
  this_00 = (error *)__cxa_allocate_exception(0x20);
  ec._4_4_ = 0;
  ec._M_value = error._M_value;
  ec._M_cat = error._M_cat;
  dynamic::error::error(this_00,ec);
  __cxa_throw(this_00,&dynamic::error::typeinfo,std::system_error::~system_error);
}

Assistant:

T into(const U& u)
{
    std::error_code error;
    auto result = into<T>(u, error);
    if (error)
        throw dynamic::error(error);
    return result;
}